

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O1

void Eigen::internal::general_matrix_vector_product<long,_double,_1,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,ResScalar alpha)

{
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  long local_c8;
  ulong local_a8;
  double *local_a0;
  
  uVar9 = (ulong)((uint)((ulong)rhs >> 3) & 1);
  if (cols <= (long)uVar9) {
    uVar9 = cols;
  }
  if (((ulong)rhs & 7) != 0) {
    uVar9 = cols;
  }
  uVar10 = (ulong)((uint)lhsStride & 1);
  uVar11 = (ulong)((uint)((ulong)lhs >> 3) & 1);
  if (cols <= (long)uVar11) {
    uVar11 = cols;
  }
  if (((ulong)lhs & 7) != 0) {
    uVar11 = cols;
  }
  local_a8 = uVar10;
  if ((((uint)rhs | (uint)lhs) & 7) == 0) {
    lVar3 = uVar9 + (cols - uVar9 & 0xfffffffffffffffe);
    lVar19 = 0;
    do {
      if (uVar9 == (long)uVar11 % 2) goto LAB_00112bf1;
      lVar19 = lVar19 + 1;
      uVar11 = uVar11 + uVar10;
    } while (lVar19 == 1);
    lVar19 = 2;
LAB_00112bf1:
    if (lVar19 == 2) {
      local_a8 = 3;
      lVar19 = 0;
    }
    else if (rows <= lVar19) {
      lVar19 = rows;
    }
  }
  else {
    lVar3 = 0;
    uVar9 = 0;
    lVar19 = 0;
  }
  uVar20 = rows - lVar19;
  uVar11 = uVar20 + 3;
  if (-1 < (long)uVar20) {
    uVar11 = uVar20;
  }
  lVar6 = (uVar11 & 0xfffffffffffffffc) + lVar19;
  if (3 < (long)uVar20) {
    lVar12 = uVar10 * 2 + 1;
    lVar1 = (ulong)(uVar10 == 0) * 2 + 1;
    lVar7 = (lVar1 + lVar19) * lhsStride;
    pdVar13 = lhs + lVar7;
    lVar14 = (lVar19 + 2) * lhsStride;
    local_a0 = lhs + lVar14;
    lVar4 = (lVar12 + lVar19) * lhsStride;
    pdVar16 = lhs + lVar4;
    pdVar17 = lhs + lVar19 * lhsStride;
    pdVar5 = lhs + lVar7 + lVar3;
    pdVar18 = lhs + lVar14 + lVar3;
    pdVar15 = lhs + lVar4 + lVar3;
    pdVar8 = lhs + lVar19 * lhsStride + lVar3;
    local_c8 = lVar19;
    do {
      if ((long)uVar9 < 1) {
        dVar24 = 0.0;
        dVar23 = 0.0;
        dVar22 = 0.0;
        dVar21 = 0.0;
      }
      else {
        dVar21 = 0.0;
        uVar11 = 0;
        dVar22 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        do {
          dVar2 = rhs[uVar11];
          dVar24 = dVar24 + pdVar17[uVar11] * dVar2;
          dVar23 = dVar23 + pdVar16[uVar11] * dVar2;
          dVar22 = dVar22 + local_a0[uVar11] * dVar2;
          dVar21 = dVar21 + dVar2 * pdVar13[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      if ((long)uVar9 < lVar3) {
        (*(code *)(&DAT_001172c0 + *(int *)(&DAT_001172c0 + local_a8 * 4)))(local_a0);
        return;
      }
      if (lVar3 < cols) {
        lVar4 = 0;
        do {
          dVar2 = rhs[lVar3 + lVar4];
          dVar24 = dVar24 + pdVar8[lVar4] * dVar2;
          dVar23 = dVar23 + pdVar15[lVar4] * dVar2;
          dVar22 = dVar22 + pdVar18[lVar4] * dVar2;
          dVar21 = dVar21 + dVar2 * pdVar5[lVar4];
          lVar4 = lVar4 + 1;
        } while (cols - lVar3 != lVar4);
      }
      res[local_c8 * resIncr] = dVar24 * alpha + res[local_c8 * resIncr];
      lVar4 = (local_c8 + lVar12) * resIncr;
      res[lVar4] = dVar23 * alpha + res[lVar4];
      lVar4 = (local_c8 + 2) * resIncr;
      res[lVar4] = dVar22 * alpha + res[lVar4];
      lVar4 = (lVar1 + local_c8) * resIncr;
      res[lVar4] = dVar21 * alpha + res[lVar4];
      local_c8 = local_c8 + 4;
      pdVar13 = pdVar13 + lhsStride * 4;
      local_a0 = local_a0 + lhsStride * 4;
      pdVar16 = pdVar16 + lhsStride * 4;
      pdVar17 = pdVar17 + lhsStride * 4;
      pdVar5 = pdVar5 + lhsStride * 4;
      pdVar18 = pdVar18 + lhsStride * 4;
      pdVar15 = pdVar15 + lhsStride * 4;
      pdVar8 = pdVar8 + lhsStride * 4;
    } while (local_c8 < lVar6);
  }
  do {
    lVar12 = lVar19;
    if (lVar6 < rows) {
      pdVar13 = (double *)(lhsStride * 8 * lVar6 + (long)lhs);
      do {
        dVar21 = 0.0;
        if (0 < (long)uVar9) {
          uVar11 = 0;
          do {
            dVar21 = dVar21 + pdVar13[uVar11] * rhs[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
        }
        if ((long)uVar9 < lVar3) {
          dVar22 = 0.0;
          dVar23 = 0.0;
          uVar11 = uVar9;
          if (((uint)lhs + (int)lVar6 * (uint)lhsStride * 8 + (int)uVar9 * 8 & 0xf) == 0) {
            for (; (long)uVar11 < lVar3; uVar11 = uVar11 + 2) {
              dVar22 = dVar22 + pdVar13[uVar11] * rhs[uVar11];
              dVar23 = dVar23 + (pdVar13 + uVar11)[1] * (rhs + uVar11)[1];
            }
          }
          else {
            for (; (long)uVar11 < lVar3; uVar11 = uVar11 + 2) {
              dVar22 = dVar22 + pdVar13[uVar11] * rhs[uVar11];
              dVar23 = dVar23 + (pdVar13 + uVar11)[1] * (rhs + uVar11)[1];
            }
          }
          dVar21 = dVar21 + dVar23 + dVar22;
        }
        lVar19 = lVar3;
        if (lVar3 < cols) {
          do {
            dVar21 = dVar21 + pdVar13[lVar19] * rhs[lVar19];
            lVar19 = lVar19 + 1;
          } while (cols != lVar19);
        }
        res[lVar6 * resIncr] = dVar21 * alpha + res[lVar6 * resIncr];
        lVar6 = lVar6 + 1;
        pdVar13 = pdVar13 + lhsStride;
      } while (lVar6 != rows);
    }
    lVar6 = 0;
    lVar19 = 0;
    rows = lVar12;
  } while (lVar12 != 0);
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,RowMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(rhsIncr);
  eigen_internal_assert(rhsIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif

  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) {\
    RhsPacket b = pload<RhsPacket>(&rhs[j]); \
    ptmp0 = pcj.pmadd(EIGEN_CAT(ploa,A0) <LhsPacket>(&lhs0[j]), b, ptmp0); \
    ptmp1 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs1[j]), b, ptmp1); \
    ptmp2 = pcj.pmadd(EIGEN_CAT(ploa,A2) <LhsPacket>(&lhs2[j]), b, ptmp2); \
    ptmp3 = pcj.pmadd(EIGEN_CAT(ploa,A13)<LhsPacket>(&lhs3[j]), b, ptmp3); }

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  enum { AllAligned=0, EvenAligned=1, FirstAligned=2, NoneAligned=3 };
  const Index rowsAtOnce = 4;
  const Index peels = 2;
  const Index RhsPacketAlignedMask = RhsPacketSize-1;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
//   const Index PeelAlignedMask = RhsPacketSize*peels-1;
  const Index depth = cols;

  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type
  // if that's not the case then vectorization is discarded, see below.
  Index alignedStart = internal::first_aligned(rhs, depth);
  Index alignedSize = RhsPacketSize>1 ? alignedStart + ((depth-alignedStart) & ~RhsPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                         : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                         : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,depth);

  // find how many rows do we have to skip to be aligned with rhs (if possible)
  Index skipRows = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (sizeof(LhsScalar)!=sizeof(RhsScalar)) || (size_t(lhs)%sizeof(LhsScalar)) || (size_t(rhs)%sizeof(RhsScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0  || depth<LhsPacketSize);

    while (skipRows<LhsPacketSize &&
           alignedStart != ((lhsAlignmentOffset + alignmentStep*skipRows)%LhsPacketSize))
      ++skipRows;
    if (skipRows==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipRows = 0;
    }
    else
    {
      skipRows = (std::min)(skipRows,Index(rows));
      // note that the skiped columns are processed later.
    }
    eigen_internal_assert(  alignmentPattern==NoneAligned
                      || LhsPacketSize==1
                      || (skipRows + rowsAtOnce >= rows)
                      || LhsPacketSize > depth
                      || (size_t(lhs+alignedStart+lhsStride*skipRows)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = depth;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index rowBound = ((rows-skipRows)/rowsAtOnce)*rowsAtOnce + skipRows;
  for (Index i=skipRows; i<rowBound; i+=rowsAtOnce)
  {
    EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
    ResScalar tmp1 = ResScalar(0), tmp2 = ResScalar(0), tmp3 = ResScalar(0);

    // this helps the compiler generating good binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      ResPacket ptmp0 = pset1<ResPacket>(ResScalar(0)), ptmp1 = pset1<ResPacket>(ResScalar(0)),
                ptmp2 = pset1<ResPacket>(ResScalar(0)), ptmp3 = pset1<ResPacket>(ResScalar(0));

      // process initial unaligned coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
      {
        RhsScalar b = rhs[j];
        tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
        tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if (peels>1)
            {
              /* Here we proccess 4 rows with with two peeled iterations to hide
               * the overhead of unaligned loads. Moreover unaligned loads are handled
               * using special shift/move operations between the two aligned packets
               * overlaping the desired unaligned packet. This is *much* more efficient
               * than basic unaligned loads.
               */
              LhsPacket A01, A02, A03, A11, A12, A13;
              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*RhsPacketSize)
              {
                RhsPacket b = pload<RhsPacket>(&rhs[j]);
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), b, ptmp0);
                ptmp1 = pcj.pmadd(A01, b, ptmp1);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                ptmp2 = pcj.pmadd(A02, b, ptmp2);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                ptmp3 = pcj.pmadd(A03, b, ptmp3);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);

                b = pload<RhsPacket>(&rhs[j+RhsPacketSize]);
                ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j+LhsPacketSize]), b, ptmp0);
                ptmp1 = pcj.pmadd(A11, b, ptmp1);
                ptmp2 = pcj.pmadd(A12, b, ptmp2);
                ptmp3 = pcj.pmadd(A13, b, ptmp3);
              }
            }
            for (; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
        tmp0 += predux(ptmp0);
        tmp1 += predux(ptmp1);
        tmp2 += predux(ptmp2);
        tmp3 += predux(ptmp3);
      }
    } // end explicit vectorization

    // process remaining coeffs (or all if no explicit vectorization)
    // FIXME this loop get vectorized by the compiler !
    for (Index j=alignedSize; j<depth; ++j)
    {
      RhsScalar b = rhs[j];
      tmp0 += cj.pmul(lhs0[j],b); tmp1 += cj.pmul(lhs1[j],b);
      tmp2 += cj.pmul(lhs2[j],b); tmp3 += cj.pmul(lhs3[j],b);
    }
    res[i*resIncr]            += alpha*tmp0;
    res[(i+offset1)*resIncr]  += alpha*tmp1;
    res[(i+2)*resIncr]        += alpha*tmp2;
    res[(i+offset3)*resIncr]  += alpha*tmp3;
  }

  // process remaining first and last rows (at most columnsAtOnce-1)
  Index end = rows;
  Index start = rowBound;
  do
  {
    for (Index i=start; i<end; ++i)
    {
      EIGEN_ALIGN16 ResScalar tmp0 = ResScalar(0);
      ResPacket ptmp0 = pset1<ResPacket>(tmp0);
      const LhsScalar* lhs0 = lhs + i*lhsStride;
      // process first unaligned result's coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);

      if (alignedSize>alignedStart)
      {
        // process aligned rhs coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(pload<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        else
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(ploadu<LhsPacket>(&lhs0[j]), pload<RhsPacket>(&rhs[j]), ptmp0);
        tmp0 += predux(ptmp0);
      }

      // process remaining scalars
      // FIXME this loop get vectorized by the compiler !
      for (Index j=alignedSize; j<depth; ++j)
        tmp0 += cj.pmul(lhs0[j], rhs[j]);
      res[i*resIncr] += alpha*tmp0;
    }
    if (skipRows)
    {
      start = 0;
      end = skipRows;
      skipRows = 0;
    }
    else
      break;
  } while(Vectorizable);

  #undef _EIGEN_ACCUMULATE_PACKETS
}